

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIff.c
# Opt level: O2

void Gia_ManIffTest(Gia_Man_t *pGia,If_LibLut_t *pLib,int fVerbose)

{
  uint nDegree;
  uint uVar1;
  Tim_Man_t *pTime;
  Iff_Man_t *p;
  Vec_Int_t *pVVar2;
  char *__s;
  Tim_Man_t *pTVar3;
  Tim_Man_t *pTemp;
  
  pTemp = (Tim_Man_t *)0x0;
  uVar1 = Gia_ManLutSizeMax(pGia);
  if ((int)uVar1 < 5) {
    uVar1 = 4;
    if (pLib->LutMax != 7) {
      if (pLib->LutMax != 10) {
        __s = "LUT library for packing 4-LUTs should have 7 or 10 inputs.";
        goto LAB_005ad69a;
      }
      goto LAB_005ad591;
    }
LAB_005ad595:
    nDegree = 2;
  }
  else {
    if (6 < uVar1) {
      __s = "The LUT size is more than 6.";
LAB_005ad69a:
      puts(__s);
      return;
    }
    uVar1 = 6;
    if (pLib->LutMax == 0xb) goto LAB_005ad595;
    if (pLib->LutMax != 0x10) {
      __s = "LUT library for packing 6-LUTs should have 11 or 16 inputs.";
      goto LAB_005ad69a;
    }
LAB_005ad591:
    nDegree = 3;
  }
  if (fVerbose != 0) {
    printf("Performing %d-clustering with %d-LUTs:\n",(ulong)nDegree,(ulong)uVar1);
  }
  pTime = (Tim_Man_t *)pGia->pManTime;
  if (pTime == (Tim_Man_t *)0x0) {
    pTime = Tim_ManStart(pGia->vCis->nSize,pGia->vCos->nSize);
    pGia->pManTime = pTime;
    pTVar3 = pTime;
    pTemp = pTime;
  }
  else {
    pTVar3 = (Tim_Man_t *)0x0;
  }
  p = Gia_ManIffPerform(pGia,pLib,pTime,uVar1,nDegree);
  if ((Tim_Man_t *)pGia->pManTime == pTVar3) {
    pGia->pManTime = (void *)0x0;
  }
  Tim_ManStopP(&pTemp);
  pVVar2 = pGia->vPacking;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      pGia->vPacking->pArray = (int *)0x0;
      pVVar2 = pGia->vPacking;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_005ad661;
    }
    free(pVVar2);
    pGia->vPacking = (Vec_Int_t *)0x0;
  }
LAB_005ad661:
  pVVar2 = Gia_ManIffSelect(p);
  pGia->vPacking = pVVar2;
  Gia_ManIffStop(p);
  if (fVerbose != 0) {
    Gia_ManPrintPackingStats(pGia);
  }
  return;
}

Assistant:

void Gia_ManIffTest( Gia_Man_t * pGia, If_LibLut_t * pLib, int fVerbose )
{
    Iff_Man_t * p;
    Tim_Man_t * pTemp = NULL;
    int nDegree = -1;
    int nLutSize = Gia_ManLutSizeMax( pGia );
    if ( nLutSize <= 4 )
    {
        nLutSize = 4;
        if ( pLib->LutMax == 7 )
            nDegree = 2;
        else if ( pLib->LutMax == 10 )
            nDegree = 3;
        else
            { printf( "LUT library for packing 4-LUTs should have 7 or 10 inputs.\n" ); return; }
    }
    else if ( nLutSize <= 6 )
    {
        nLutSize = 6;
        if ( pLib->LutMax == 11 )
            nDegree = 2;
        else if ( pLib->LutMax == 16 )
            nDegree = 3;
        else
            { printf( "LUT library for packing 6-LUTs should have 11 or 16 inputs.\n" ); return; }
    }
    else
    {
        printf( "The LUT size is more than 6.\n" );
        return;
    }
    if ( fVerbose )
        printf( "Performing %d-clustering with %d-LUTs:\n", nDegree, nLutSize );
    // create timing manager
    if ( pGia->pManTime == NULL )
        pGia->pManTime = pTemp = Tim_ManStart( Gia_ManCiNum(pGia), Gia_ManCoNum(pGia) );
    // perform timing computation
    p = Gia_ManIffPerform( pGia, pLib, (Tim_Man_t *)pGia->pManTime, nLutSize, nDegree );
    // remove timing manager
    if ( pGia->pManTime == pTemp )
        pGia->pManTime = NULL;
    Tim_ManStopP( (Tim_Man_t **)&pTemp );
    // derive clustering
    Vec_IntFreeP( &pGia->vPacking );
    pGia->vPacking = Gia_ManIffSelect( p );
    Gia_ManIffStop( p );
    // print statistics
    if ( fVerbose )
        Gia_ManPrintPackingStats( pGia );
}